

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O1

void __thiscall
duckdb::WriteAheadLogSerializer::~WriteAheadLogSerializer(WriteAheadLogSerializer *this)

{
  pointer pcVar1;
  
  (this->serializer).super_Serializer._vptr_Serializer =
       (_func_int **)&PTR__BinarySerializer_01997298;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->serializer).data.customs._M_h);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
                  *)&(this->serializer).data.compression_infos);
  ::std::
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  *)&(this->serializer).data.types);
  ::std::
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
                  *)&(this->serializer).data.parameter_data);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &(this->serializer).data.enums);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                  *)&(this->serializer).data.catalogs);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
                  *)&(this->serializer).data.databases);
  ::std::
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                  *)&(this->serializer).data);
  ::std::
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  ::~vector(&(this->serializer).debug_stack.
             super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
           );
  Serializer::~Serializer(&(this->serializer).super_Serializer);
  pcVar1 = (this->options).serialization_compatibility.duckdb_version._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options).serialization_compatibility.duckdb_version.field_2) {
    operator_delete(pcVar1);
  }
  (this->checksum_writer).super_WriteStream._vptr_WriteStream =
       (_func_int **)&PTR_WriteData_019a9d10;
  MemoryStream::~MemoryStream(&(this->checksum_writer).memory_stream);
  return;
}

Assistant:

WriteAheadLogSerializer(WriteAheadLog &wal, WALType wal_type)
	    : checksum_writer(wal), serializer(checksum_writer, SerializationOptions(wal.GetDatabase())) {
		if (!wal.Initialized()) {
			wal.Initialize();
		}
		// write a version marker if none has been written yet
		wal.WriteVersion();
		serializer.Begin();
		serializer.WriteProperty(100, "wal_type", wal_type);
	}